

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suprun.c
# Opt level: O0

void sup_log_undefobj(mcmcxdef *mctx,errcxdef *ec,int err,char *nm,int nmlen,objnum objn)

{
  objnum oVar1;
  uchar *puVar2;
  errcxdef *ctx;
  size_t sVar3;
  char *pcVar4;
  errcxdef *in_RCX;
  long *in_RSI;
  undefined4 in_R8D;
  undefined2 in_R9W;
  size_t len;
  uchar *p;
  undefined8 in_stack_ffffffffffffffd0;
  mcmon objnum;
  undefined2 in_stack_ffffffffffffffd8;
  undefined2 uVar5;
  objnum objn_00;
  
  objnum = (mcmon)((ulong)in_stack_ffffffffffffffd0 >> 0x30);
  uVar5 = (undefined2)in_R8D;
  objn_00 = (objnum)((uint)in_R8D >> 0x10);
  oVar1 = objget1sc((mcmcxdef *)in_RCX,objn_00);
  if (oVar1 == 0xffff) {
    puVar2 = mcmlck((mcmcxdef *)
                    CONCAT26(objn_00,CONCAT24(uVar5,CONCAT22(in_R9W,in_stack_ffffffffffffffd8))),
                    objnum);
    ctx = (errcxdef *)(puVar2 + 0xe);
    sVar3 = strlen((char *)ctx);
    pcVar4 = errstr(in_RCX,(char *)CONCAT26(objn_00,CONCAT24(uVar5,CONCAT22(in_R9W,
                                                  in_stack_ffffffffffffffd8))),
                    (int)((ulong)ctx >> 0x20));
    *(char **)(*in_RSI + 0x18) = pcVar4;
    pcVar4 = errstr(in_RCX,(char *)CONCAT26(objn_00,CONCAT24(uVar5,CONCAT22(in_R9W,
                                                  in_stack_ffffffffffffffd8))),
                    (int)((ulong)ctx >> 0x20));
    *(char **)(*in_RSI + 0x20) = pcVar4;
    *(undefined4 *)(*in_RSI + 0x68) = 2;
    errlogn(ctx,(int)(sVar3 >> 0x20),(char *)0x15c5cd);
    mcmunlck((mcmcxdef *)ctx,(mcmon)(sVar3 >> 0x30));
  }
  return;
}

Assistant:

void sup_log_undefobj(mcmcxdef *mctx, errcxdef *ec, int err,
                      char *nm, int nmlen, objnum objn)
{
    uchar  *p;
    size_t  len;

    /* 
     *   if the object has any superclasses defined, what must have
     *   happened is that we encountered an error in the course of
     *   defining the object; the object is partially defined, hence it
     *   won't show up in our records of defined objects, yet it really
     *   shouldn't count as an undefined object; simply suppress the
     *   message in this case 
     */
    if (objget1sc(mctx, objn) != MCMONINV)
        return;

    /* get the object - it contains the location where it was defined */
    p = mcmlck(mctx, (mcmon)objn);

    /* skip the object header */
    p += OBJDEFSIZ;

    /* get the length of the name */
    len = strlen((char *)p);

#ifdef OS_ERRLINE
    len += strlen((char *)p + len + 1);
#endif

    /* log the error */
    errlog2(ec, err, ERRTSTR, errstr(ec, nm, nmlen),
            ERRTSTR, errstr(ec, (char *)p, len));

    /* done with the object */
    mcmunlck(mctx, (mcmon)objn);
}